

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O0

anon_class_136_17_7d744f41_conflict * __thiscall
qclab::qgates::lambda_QGate2<std::complex<float>>
          (anon_class_136_17_7d744f41_conflict *__return_storage_ptr__,qgates *this,Op op,
          SquareMatrix<std::complex<float>_> *mat2,complex<float> *vector)

{
  _ComplexT _Var1;
  _ComplexT _Var2;
  _ComplexT _Var3;
  _ComplexT _Var4;
  _ComplexT _Var5;
  _ComplexT _Var6;
  _ComplexT _Var7;
  _ComplexT _Var8;
  _ComplexT _Var9;
  _ComplexT _Var10;
  _ComplexT _Var11;
  _ComplexT _Var12;
  _ComplexT _Var13;
  _ComplexT _Var14;
  int64_t iVar15;
  complex<float> *pcVar16;
  complex<float> *pcVar17;
  undefined7 in_register_00000011;
  SquareMatrix<std::complex<float>_> *this_00;
  SquareMatrix<std::complex<float>_> *local_128;
  anon_class_136_17_7d744f41_conflict f;
  complex<float> m44;
  complex<float> m43;
  complex<float> m42;
  complex<float> m41;
  complex<float> m34;
  complex<float> m33;
  complex<float> m32;
  complex<float> m31;
  complex<float> m24;
  complex<float> m23;
  complex<float> m22;
  complex<float> m21;
  complex<float> m14;
  complex<float> m13;
  complex<float> m12;
  complex<float> m11;
  complex<float> *vector_local;
  SquareMatrix<std::complex<float>_> *mat2_local;
  Op op_local;
  
  this_00 = (SquareMatrix<std::complex<float>_> *)CONCAT71(in_register_00000011,op);
  iVar15 = dense::SquareMatrix<std::complex<float>_>::size(this_00);
  if (iVar15 == 4) {
    dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>((Op)this,this_00);
    pcVar16 = dense::SquareMatrix<std::complex<float>_>::operator()(this_00,0,0);
    pcVar16 = (complex<float> *)pcVar16->_M_value;
    pcVar17 = dense::SquareMatrix<std::complex<float>_>::operator()(this_00,0,1);
    _Var1 = pcVar17->_M_value;
    pcVar17 = dense::SquareMatrix<std::complex<float>_>::operator()(this_00,0,2);
    _Var2 = pcVar17->_M_value;
    pcVar17 = dense::SquareMatrix<std::complex<float>_>::operator()(this_00,0,3);
    _Var3 = pcVar17->_M_value;
    pcVar17 = dense::SquareMatrix<std::complex<float>_>::operator()(this_00,1,0);
    _Var4 = pcVar17->_M_value;
    pcVar17 = dense::SquareMatrix<std::complex<float>_>::operator()(this_00,1,1);
    _Var5 = pcVar17->_M_value;
    pcVar17 = dense::SquareMatrix<std::complex<float>_>::operator()(this_00,1,2);
    _Var6 = pcVar17->_M_value;
    pcVar17 = dense::SquareMatrix<std::complex<float>_>::operator()(this_00,1,3);
    _Var7 = pcVar17->_M_value;
    pcVar17 = dense::SquareMatrix<std::complex<float>_>::operator()(this_00,2,0);
    _Var8 = pcVar17->_M_value;
    pcVar17 = dense::SquareMatrix<std::complex<float>_>::operator()(this_00,2,1);
    _Var9 = pcVar17->_M_value;
    pcVar17 = dense::SquareMatrix<std::complex<float>_>::operator()(this_00,2,2);
    _Var10 = pcVar17->_M_value;
    pcVar17 = dense::SquareMatrix<std::complex<float>_>::operator()(this_00,2,3);
    _Var11 = pcVar17->_M_value;
    pcVar17 = dense::SquareMatrix<std::complex<float>_>::operator()(this_00,3,0);
    _Var12 = pcVar17->_M_value;
    pcVar17 = dense::SquareMatrix<std::complex<float>_>::operator()(this_00,3,1);
    _Var13 = pcVar17->_M_value;
    pcVar17 = dense::SquareMatrix<std::complex<float>_>::operator()(this_00,3,2);
    _Var14 = pcVar17->_M_value;
    pcVar17 = dense::SquareMatrix<std::complex<float>_>::operator()(this_00,3,3);
    f.m43._M_value = pcVar17->_M_value;
    local_128 = mat2;
    f.vector = pcVar16;
    f.m11._M_value = _Var1;
    f.m12._M_value = _Var2;
    f.m13._M_value = _Var3;
    f.m14._M_value = _Var4;
    f.m21._M_value = _Var5;
    f.m22._M_value = _Var6;
    f.m23._M_value = _Var7;
    f.m24._M_value = _Var8;
    f.m31._M_value = _Var9;
    f.m32._M_value = _Var10;
    f.m33._M_value = _Var11;
    f.m34._M_value = _Var12;
    f.m41._M_value = _Var13;
    f.m42._M_value = _Var14;
    f.m44._M_value = f.m43._M_value;
    memcpy(__return_storage_ptr__,&local_128,0x88);
    return __return_storage_ptr__;
  }
  __assert_fail("mat2.size() == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/apply.hpp"
                ,0xae,
                "auto qclab::qgates::lambda_QGate2(Op, qclab::dense::SquareMatrix<T>, T *) [T = std::complex<float>]"
               );
}

Assistant:

auto lambda_QGate2( Op op , qclab::dense::SquareMatrix< T > mat2 ,
                      T* vector ) {
    assert( mat2.size() == 4 ) ;
    // operation
    qclab::dense::operateInPlace( op , mat2 ) ;
    const T m11 = mat2( 0 , 0 ) ; const T m12 = mat2( 0 , 1 ) ;
    const T m13 = mat2( 0 , 2 ) ; const T m14 = mat2( 0 , 3 ) ;
    const T m21 = mat2( 1 , 0 ) ; const T m22 = mat2( 1 , 1 ) ;
    const T m23 = mat2( 1 , 2 ) ; const T m24 = mat2( 1 , 3 ) ;
    const T m31 = mat2( 2 , 0 ) ; const T m32 = mat2( 2 , 1 ) ;
    const T m33 = mat2( 2 , 2 ) ; const T m34 = mat2( 2 , 3 ) ;
    const T m41 = mat2( 3 , 0 ) ; const T m42 = mat2( 3 , 1 ) ;
    const T m43 = mat2( 3 , 2 ) ; const T m44 = mat2( 3 , 3 ) ;
    // matvec
    auto f = [=] ( const uint64_t a , const uint64_t b ,
                   const uint64_t c , const uint64_t d ) {
      const T x1 = vector[a] ;
      const T x2 = vector[b] ;
      const T x3 = vector[c] ;
      const T x4 = vector[d] ;
      vector[a] = m11 * x1 + m12 * x2 + m13 * x3 + m14 * x4 ;
      vector[b] = m21 * x1 + m22 * x2 + m23 * x3 + m24 * x4 ;
      vector[c] = m31 * x1 + m32 * x2 + m33 * x3 + m34 * x4 ;
      vector[d] = m41 * x1 + m42 * x2 + m43 * x3 + m44 * x4 ;
    } ;
    return f ;
  }